

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r611_handler.cpp
# Opt level: O0

bool __thiscall
ismsnoop::R611Handler::looks_like_the_info_text
          (R611Handler *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *buffer,int *next)

{
  const_reference pvVar1;
  int *next_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *buffer_local;
  R611Handler *this_local;
  
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](buffer,0);
  if ((((*pvVar1 == 0x40000) &&
       (pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](buffer,1),
       *pvVar1 == 0x80000)) &&
      (pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](buffer,2),
      *pvVar1 == 0x80000)) &&
     (((pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](buffer,3),
       *pvVar1 == 0x20000 &&
       (pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](buffer,4),
       *pvVar1 == 0x1010000)) &&
      (pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](buffer,5),
      *pvVar1 == 0x1010101)))) {
    *next = 9;
    return true;
  }
  return false;
}

Assistant:

bool R611Handler::looks_like_the_info_text(const std::vector<uint32_t> & buffer, int * next)
{
	if (buffer[0] == 262144
		&& buffer[1] == 524288
		&& buffer[2] == 524288
		&& buffer[3] == 131072
		&& buffer[4] == 16842752
		&& buffer[5] == 16843009)
	{
		*next = 9;
		return true;
	}

	return false;
}